

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

size_t kvtree_elem_pack_size(kvtree_elem *elem)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_18;
  size_t size;
  kvtree_elem *elem_local;
  
  if (elem == (kvtree_elem *)0x0) {
    local_18 = kvtree_pack_size((kvtree *)0x0);
    local_18 = local_18 + 1;
  }
  else {
    if (elem->key == (char *)0x0) {
      local_18 = 1;
    }
    else {
      sVar1 = strlen(elem->key);
      local_18 = sVar1 + 1;
    }
    sVar2 = kvtree_pack_size(elem->hash);
    local_18 = sVar2 + local_18;
  }
  return local_18;
}

Assistant:

static size_t kvtree_elem_pack_size(const kvtree_elem* elem)
{
  size_t size = 0;
  if (elem != NULL) {
    if (elem->key != NULL) {
      size += strlen(elem->key) + 1;
    } else {
      size += 1;
    }
    size += kvtree_pack_size(elem->hash);
  } else {
    size += 1;
    size += kvtree_pack_size(NULL);
  }
  return size;
}